

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::StartListValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx)

{
  long lVar1;
  idx_t iVar2;
  idx_t in_RSI;
  long in_RDI;
  idx_t idx;
  TYPE *data;
  undefined8 local_8;
  
  iVar2 = DataChunk::ColumnCount((DataChunk *)0xd956f0);
  if (iVar2 == 1) {
    local_8 = TimestampRangeInfo::DefaultStart();
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x10);
    iVar2 = SelectionVector::get_index(*(SelectionVector **)(in_RDI + 8),in_RSI);
    local_8 = *(int64_t *)(lVar1 + iVar2 * 8);
  }
  return (TYPE)local_8;
}

Assistant:

typename OP::TYPE StartListValue(idx_t row_idx) {
		if (args.ColumnCount() == 1) {
			return OP::DefaultStart();
		} else {
			auto data = (typename OP::TYPE *)vdata[0].data;
			auto idx = vdata[0].sel->get_index(row_idx);
			return data[idx];
		}
	}